

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  if (this != other) {
    std::__cxx11::string::operator=((string *)&this->mName,(string *)&other->mName);
    (this->mDiffuse).r = (other->mDiffuse).r;
    (this->mDiffuse).g = (other->mDiffuse).g;
    (this->mDiffuse).b = (other->mDiffuse).b;
    this->mSpecularExponent = other->mSpecularExponent;
    this->mShininessStrength = other->mShininessStrength;
    (this->mSpecular).r = (other->mSpecular).r;
    (this->mSpecular).g = (other->mSpecular).g;
    (this->mSpecular).b = (other->mSpecular).b;
    (this->mAmbient).r = (other->mAmbient).r;
    (this->mAmbient).g = (other->mAmbient).g;
    (this->mAmbient).b = (other->mAmbient).b;
    this->mShading = other->mShading;
    this->mTransparency = other->mTransparency;
    Texture::operator=(&this->sTexDiffuse,&other->sTexDiffuse);
    Texture::operator=(&this->sTexOpacity,&other->sTexOpacity);
    Texture::operator=(&this->sTexSpecular,&other->sTexSpecular);
    Texture::operator=(&this->sTexReflective,&other->sTexReflective);
    Texture::operator=(&this->sTexBump,&other->sTexBump);
    Texture::operator=(&this->sTexEmissive,&other->sTexEmissive);
    Texture::operator=(&this->sTexShininess,&other->sTexShininess);
    this->mBumpHeight = other->mBumpHeight;
    (this->mEmissive).r = (other->mEmissive).r;
    (this->mEmissive).g = (other->mEmissive).g;
    (this->mEmissive).b = (other->mEmissive).b;
    Texture::operator=(&this->sTexAmbient,&other->sTexAmbient);
    this->mTwoSided = other->mTwoSided;
  }
  return this;
}

Assistant:

Material &operator=(Material &&other) AI_NO_EXCEPT {
        if (this == &other) {
            return *this;
        }

        mName = std::move(other.mName);
        mDiffuse = std::move(other.mDiffuse);
        mSpecularExponent = std::move(other.mSpecularExponent);
        mShininessStrength = std::move(other.mShininessStrength),
        mSpecular = std::move(other.mSpecular);
        mAmbient = std::move(other.mAmbient);
        mShading = std::move(other.mShading);
        mTransparency = std::move(other.mTransparency);
        sTexDiffuse = std::move(other.sTexDiffuse);
        sTexOpacity = std::move(other.sTexOpacity);
        sTexSpecular = std::move(other.sTexSpecular);
        sTexReflective = std::move(other.sTexReflective);
        sTexBump = std::move(other.sTexBump);
        sTexEmissive = std::move(other.sTexEmissive);
        sTexShininess = std::move(other.sTexShininess);
        mBumpHeight = std::move(other.mBumpHeight);
        mEmissive = std::move(other.mEmissive);
        sTexAmbient = std::move(other.sTexAmbient);
        mTwoSided = std::move(other.mTwoSided);

        return *this;
    }